

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int dump_active_event_fn(event_base *base,event *e,void *arg)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  FILE *output;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  
  uVar1 = (e->ev_evcallback).evcb_flags;
  if ((uVar1 & 0x28) != 0) {
    pcVar3 = "sig";
    if ((e->ev_events & 8U) == 0) {
      pcVar3 = "fd ";
    }
    uVar2 = e->ev_res;
    pcVar6 = " Read";
    if ((uVar2 & 2) == 0) {
      pcVar6 = "";
    }
    pcVar7 = " Write";
    if ((uVar2 & 4) == 0) {
      pcVar7 = "";
    }
    pcVar4 = " EOF";
    if (-1 < (char)uVar2) {
      pcVar4 = "";
    }
    pcVar10 = " Signal";
    if ((uVar2 & 8) == 0) {
      pcVar10 = "";
    }
    pcVar8 = " Timeout";
    if ((uVar2 & 1) == 0) {
      pcVar8 = "";
    }
    pcVar9 = " [Internal]";
    if ((uVar1 & 0x10) == 0) {
      pcVar9 = "";
    }
    pcVar5 = " [NextTime]";
    if ((uVar1 & 0x20) == 0) {
      pcVar5 = "";
    }
    fprintf((FILE *)arg,"  %p [%s %d, priority=%d]%s%s%s%s%s active%s%s\n",e,pcVar3,
            (ulong)(uint)e->ev_fd,(ulong)(e->ev_evcallback).evcb_pri,pcVar6,pcVar7,pcVar4,pcVar10,
            pcVar8,pcVar9,pcVar5);
  }
  return 0;
}

Assistant:

static int
dump_active_event_fn(const struct event_base *base, const struct event *e, void *arg)
{
	FILE *output = arg;
	const char *gloss = (e->ev_events & EV_SIGNAL) ?
	    "sig" : "fd ";

	if (! (e->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)))
		return 0;

	fprintf(output, "  %p [%s "EV_SOCK_FMT", priority=%d]%s%s%s%s%s active%s%s\n",
	    (void*)e, gloss, EV_SOCK_ARG(e->ev_fd), e->ev_pri,
	    (e->ev_res&EV_READ)?" Read":"",
	    (e->ev_res&EV_WRITE)?" Write":"",
	    (e->ev_res&EV_CLOSED)?" EOF":"",
	    (e->ev_res&EV_SIGNAL)?" Signal":"",
	    (e->ev_res&EV_TIMEOUT)?" Timeout":"",
	    (e->ev_flags&EVLIST_INTERNAL)?" [Internal]":"",
	    (e->ev_flags&EVLIST_ACTIVE_LATER)?" [NextTime]":"");

	return 0;
}